

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O3

void __thiscall Mpp::Mpp(Mpp *this,MppCtx ctx)

{
  byte *pbVar1;
  
  *(undefined8 *)((long)&this->mPacketGroup + 4) = 0;
  *(undefined8 *)((long)&this->mFrameGroup + 4) = 0;
  this->mTaskPutCount = 0;
  this->mTaskGetCount = 0;
  this->mPacketGroup = (MppBufferGroup)0x0;
  this->mPacketPutCount = 0;
  this->mPacketGetCount = 0;
  this->mFramePutCount = 0;
  this->mFrameGetCount = 0;
  this->mFrmIn = (mpp_list *)0x0;
  this->mFrmOut = (mpp_list *)0x0;
  this->mPktIn = (mpp_list *)0x0;
  this->mPktOut = (mpp_list *)0x0;
  this->mUsrInPort = (MppPort)0x0;
  this->mUsrOutPort = (MppPort)0x0;
  this->mMppInPort = (MppPort)0x0;
  this->mMppOutPort = (MppPort)0x0;
  this->mInputTaskQueue = (MppTaskQueue)0x0;
  this->mOutputTaskQueue = (MppTaskQueue)0x0;
  this->mInputTaskCount = 1;
  this->mOutputTaskCount = 1;
  this->mInputTimeout = MPP_POLL_BUTT;
  this->mOutputTimeout = MPP_POLL_BUTT;
  this->mInputTask = (MppTask)0x0;
  this->mEosTask = (MppTask)0x0;
  this->mCtx = ctx;
  this->mDec = (MppDec)0x0;
  this->mEnc = (MppEnc)0x0;
  this->mEncAyncIo = 0;
  this->mEncAyncProc = 0;
  this->mIoMode = MPP_IO_MODE_DEFAULT;
  this->mDisableThread = 0;
  this->mDump = (MppDump)0x0;
  this->mType = MPP_CTX_BUTT;
  this->mCoding = MPP_VIDEO_CodingUnused;
  this->mInitDone = 0;
  this->mStatus = 0;
  this->mExtraPacket = (MppPacket)0x0;
  mpp_env_get_u32("mpp_debug",&mpp_debug,0);
  memset(&this->mDecInitcfg,0,0xa0);
  mpp_dec_cfg_set_default(&this->mDecInitcfg);
  (this->mDecInitcfg).base.enable_vproc = 1;
  pbVar1 = (byte *)((long)&(this->mDecInitcfg).base.change + 1);
  *pbVar1 = *pbVar1 | 0x80;
  this->mKmpp = (Kmpp *)0x0;
  this->mVencInitKcfg = (KmppObj)0x0;
  mpp_dump_init(&this->mDump);
  return;
}

Assistant:

Mpp::Mpp(MppCtx ctx)
    : mPktIn(NULL),
      mPktOut(NULL),
      mFrmIn(NULL),
      mFrmOut(NULL),
      mPacketPutCount(0),
      mPacketGetCount(0),
      mFramePutCount(0),
      mFrameGetCount(0),
      mTaskPutCount(0),
      mTaskGetCount(0),
      mPacketGroup(NULL),
      mFrameGroup(NULL),
      mExternalBufferMode(0),
      mUsrInPort(NULL),
      mUsrOutPort(NULL),
      mMppInPort(NULL),
      mMppOutPort(NULL),
      mInputTaskQueue(NULL),
      mOutputTaskQueue(NULL),
      mInputTaskCount(1),
      mOutputTaskCount(1),
      mInputTimeout(MPP_POLL_BUTT),
      mOutputTimeout(MPP_POLL_BUTT),
      mInputTask(NULL),
      mEosTask(NULL),
      mCtx(ctx),
      mDec(NULL),
      mEnc(NULL),
      mEncAyncIo(0),
      mEncAyncProc(0),
      mIoMode(MPP_IO_MODE_DEFAULT),
      mDisableThread(0),
      mDump(NULL),
      mType(MPP_CTX_BUTT),
      mCoding(MPP_VIDEO_CodingUnused),
      mInitDone(0),
      mStatus(0),
      mExtraPacket(NULL)
{
    mpp_env_get_u32("mpp_debug", &mpp_debug, 0);

    memset(&mDecInitcfg, 0, sizeof(mDecInitcfg));
    mpp_dec_cfg_set_default(&mDecInitcfg);
    mDecInitcfg.base.enable_vproc = MPP_VPROC_MODE_DEINTELACE;
    mDecInitcfg.base.change  |= MPP_DEC_CFG_CHANGE_ENABLE_VPROC;
    mKmpp = NULL;
    mVencInitKcfg = NULL;
    mpp_dump_init(&mDump);
}